

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRecognized(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,int index)

{
  iterator iVar1;
  bool bVar2;
  key_type local_24;
  
  CLI::std::mutex::lock((mutex *)&this->promiseLock);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)this,&local_24);
  bVar2 = true;
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(this->usedPromiseByInteger)._M_t,&local_24);
    bVar2 = (_Rb_tree_header *)iVar1._M_node !=
            &(this->usedPromiseByInteger)._M_t._M_impl.super__Rb_tree_header;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
  return bVar2;
}

Assistant:

bool isRecognized(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            return true;
        }
        auto fnd2 = usedPromiseByInteger.find(index);
        if (fnd2 != usedPromiseByInteger.end()) {
            return true;
        }
        return false;
    }